

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O1

void __thiscall iu_Matcher_x_iutest_x_Each_Test::Body(iu_Matcher_x_iutest_x_Each_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AssertionResult *in_R8;
  AssertionResult iutest_ar;
  iu_global_format_stringstream strm;
  detail *local_3d0;
  long local_3c0 [2];
  string local_3b0;
  AssertionResult local_390;
  AssertionHelper local_368;
  undefined1 local_338 [16];
  undefined1 local_328 [112];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [392];
  
  local_338._0_8_ = &PTR__IMatcher_00240ea0;
  local_338._8_4_ = 1;
  iutest::detail::EachMatcher<int>::operator()
            (&local_390,(EachMatcher<int> *)local_338,(int (*) [3])(anonymous_namespace)::gc);
  if (local_390.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_338);
    iutest::detail::iuUniversalPrinter<int[3]>::Print
              ((int (*) [3])(anonymous_namespace)::gc,(iu_ostream *)local_328);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
    std::ios_base::~ios_base(local_2b8);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3b0,local_3d0,"Each(1)",(char *)&local_390,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,local_3b0._M_dataplus._M_p,(allocator<char> *)local_338);
    local_368.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_368.m_part_result.super_iuCodeMessage.m_line = 0x123;
    local_368.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_368,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_368.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_368.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
    if (local_3d0 != (detail *)local_3c0) {
      operator_delete(local_3d0,local_3c0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
  }
  paVar1 = &local_390.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_390.m_message._M_dataplus._M_p,
                    local_390.m_message.field_2._M_allocated_capacity + 1);
  }
  local_1b0._0_4_ = 10;
  local_338._0_8_ = &PTR__EachMatcher_00240ee0;
  local_338._8_8_ = &PTR__IMatcher_0023f610;
  local_328._0_8_ = local_1b0;
  iutest::detail::EachMatcher<iutest::detail::LeMatcher<int>>::operator()
            (&local_390,(EachMatcher<iutest::detail::LeMatcher<int>> *)local_338,
             (vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::va);
  if (local_390.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_338);
    iutest::detail::DefaultPrintTo<std::vector<int,std::allocator<int>>>
              (0,&(anonymous_namespace)::va,local_328);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
    std::ios_base::~ios_base(local_2b8);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3b0,local_3d0,"Each(Le(10))",(char *)&local_390,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,local_3b0._M_dataplus._M_p,(allocator<char> *)local_338);
    local_368.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_368.m_part_result.super_iuCodeMessage.m_line = 0x124;
    local_368.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_368,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_368.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_368.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
    if (local_3d0 != (detail *)local_3c0) {
      operator_delete(local_3d0,local_3c0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_390.m_message._M_dataplus._M_p,
                    local_390.m_message.field_2._M_allocated_capacity + 1);
  }
  local_1b0._0_4_ = 10;
  local_338._0_8_ = &PTR__EachMatcher_00240f20;
  local_338._8_8_ = &PTR__EachMatcher_00240ee0;
  local_328._0_8_ = &PTR__IMatcher_0023f610;
  local_328._8_8_ = local_1b0;
  iutest::detail::EachMatcher<iutest::detail::EachMatcher<iutest::detail::LeMatcher<int>>>::
  operator()(&local_390,
             (EachMatcher<iutest::detail::EachMatcher<iutest::detail::LeMatcher<int>>> *)local_338,
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)(anonymous_namespace)::vv);
  if (local_390.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_338);
    iutest::detail::
    DefaultPrintTo<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
              (0,(anonymous_namespace)::vv,local_328);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
    std::ios_base::~ios_base(local_2b8);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3b0,local_3d0,"Each(Each(Le(10)))",(char *)&local_390,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,local_3b0._M_dataplus._M_p,(allocator<char> *)local_338);
    local_368.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_368.m_part_result.super_iuCodeMessage.m_line = 0x125;
    local_368.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_368,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_368.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_368.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_368.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
    if (local_3d0 != (detail *)local_3c0) {
      operator_delete(local_3d0,local_3c0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_390.m_message._M_dataplus._M_p,
                    local_390.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(MatcherFailure, At)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT(gb, At(2, 2)), "At 2: 2" );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(va, At(1, Gt(1))), "At 1: Gt: 1" );
}